

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputerPlayer.cpp
# Opt level: O2

Card * __thiscall ComputerPlayer::greatestOnTable(ComputerPlayer *this)

{
  Card *this_00;
  bool bVar1;
  Deal *this_01;
  Contract *c;
  pointer ppCVar2;
  Card *rhs;
  
  ppCVar2 = (this->cardsOnTable).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = *ppCVar2;
  while (rhs = this_00, ppCVar2 = ppCVar2 + 1,
        ppCVar2 !=
        (this->cardsOnTable).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
    this_00 = *ppCVar2;
    this_01 = Game::getCurrentDeal((this->super_Player)._game);
    c = Deal::getContract(this_01);
    bVar1 = Card::isBigger(this_00,rhs,c);
    if (!bVar1) {
      this_00 = rhs;
    }
  }
  return rhs;
}

Assistant:

Card *ComputerPlayer::greatestOnTable() {
    vector<Card *>::iterator iter = cardsOnTable.begin();
    Card *greatest = *iter;

    //greatest Card on the table
    Card *tmp = *iter;
    for (++iter; iter != cardsOnTable.end(); ++iter) {
        tmp = *iter;
        if (tmp->isBigger(greatest, _game->getCurrentDeal()->getContract()))
            greatest = tmp;

        //std::cout << ' ' << greatest->getValue() << '\n';
    }

    return greatest;
}